

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

Error __thiscall
llvm::Expected<llvm::StrOffsetsContributionDescriptor>::takeError
          (Expected<llvm::StrOffsetsContributionDescriptor> *this)

{
  ErrorInfoBase *pEVar1;
  error_type *peVar2;
  ulong uVar3;
  Expected<llvm::StrOffsetsContributionDescriptor> *in_RSI;
  
  if ((in_RSI->field_0x18 & 1) == 0) {
    uVar3 = 1;
  }
  else {
    peVar2 = getErrorStorage(in_RSI);
    pEVar1 = (peVar2->_M_t).
             super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
             .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
    (peVar2->_M_t).
    super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
    super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
    super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl = (ErrorInfoBase *)0x0;
    uVar3 = (ulong)pEVar1 | 1;
  }
  *(ulong *)(this->field_0).ErrorStorage.buffer = uVar3;
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error takeError() {
#if LLVM_ENABLE_ABI_BREAKING_CHECKS
    Unchecked = false;
#endif
    return HasError ? Error(std::move(*getErrorStorage())) : Error::success();
  }